

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_rcu_list.h
# Opt level: O0

unique_ptr<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>_>
* __thiscall
libguarded::detail::
allocate_unique<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node,std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>,CsSignal::SignalBase::ConnectStruct>
          (unique_ptr<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node,_libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>_>
           *__return_storage_ptr__,detail *this,
          allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>
          *alloc,ConnectStruct *args)

{
  pointer __p;
  deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
  local_35 [13];
  pointer local_28;
  pointer p;
  ConnectStruct *args_local;
  allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>
  *alloc_local;
  
  p = (pointer)alloc;
  args_local = (ConnectStruct *)this;
  alloc_local = (allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>
                 *)__return_storage_ptr__;
  local_28 = std::
             allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
             ::allocate((allocator_type *)this,1);
  std::
  allocator_traits<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>>
  ::
  construct<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node,CsSignal::SignalBase::ConnectStruct>
            ((allocator_type *)args_local,local_28,(ConnectStruct *)p);
  __p = local_28;
  deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
  ::deallocator(local_35,(allocator_type *)args_local);
  std::
  unique_ptr<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node,libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>>>
  ::
  unique_ptr<libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>>,void>
            ((unique_ptr<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node,libguarded::detail::deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,std::mutex,std::allocator<CsSignal::SignalBase::ConnectStruct>>::node>>>
              *)__return_storage_ptr__,__p,local_35);
  deallocator<std::allocator<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>::node>_>
  ::~deallocator(local_35);
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<T, deallocator<Alloc>> allocate_unique(Alloc &alloc, Args &&... args)
{
   using allocator_traits = std::allocator_traits<Alloc>;

   auto p = allocator_traits::allocate(alloc, 1);

   try {
      allocator_traits::construct(alloc, p, std::forward<Args>(args)...);
      return {p, deallocator<Alloc>{alloc}};

   } catch (...) {
      allocator_traits::deallocate(alloc, p, 1);
      throw;
   }
}